

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getSimplexIterationCount(void *highs)

{
  HighsInfo *pHVar1;
  Highs *in_RDI;
  string *alt_method_name;
  string *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  undefined1 local_29 [33];
  Highs *local_8;
  
  alt_method_name = (string *)local_29;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_29 + 1),"Highs_getSimplexIterationCount",(allocator *)alt_method_name)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"Highs_getIntInfoValue",
             (allocator *)&stack0xffffffffffffff9f);
  Highs::deprecationMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  pHVar1 = Highs::getInfo(local_8);
  return (pHVar1->super_HighsInfoStruct).simplex_iteration_count;
}

Assistant:

HighsInt Highs_getSimplexIterationCount(const void* highs) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_getSimplexIterationCount",
                           "Highs_getIntInfoValue");
  return (HighsInt)((Highs*)highs)->getInfo().simplex_iteration_count;
}